

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::iterate(ViewportIndexSubroutine *this)

{
  bool bVar1;
  IterateResult IVar2;
  RenderContext *pRVar3;
  NotSupportedError *this_00;
  ApiType local_1c;
  ApiType *local_18;
  ContextType *context_type;
  ViewportIndexSubroutine *this_local;
  
  context_type = (ContextType *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_DrawTestBase).super_TestCaseBase.m_context);
  local_1c.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_18 = &local_1c;
  bVar1 = glu::isContextTypeGLCore((ContextType)local_1c.m_bits);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Subroutines not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xe31);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  IVar2 = DrawTestBase::iterate(&this->super_DrawTestBase);
  return IVar2;
}

Assistant:

tcu::TestNode::IterateResult ViewportIndexSubroutine::iterate()
{
	/* this exists solely to check for subroutine support, which is not supported in ES.
	   The real work is done in DrawTestBase::iterate() */
	const glu::ContextType& context_type = m_context.getRenderContext().getType();
	if (!glu::isContextTypeGLCore(context_type))
	{
		throw tcu::NotSupportedError("Subroutines not supported", "", __FILE__, __LINE__);
	}

	return DrawTestBase::iterate();
}